

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

int fmt::v11::detail::get_dynamic_spec<fmt::v11::context>
              (arg_id_kind kind,arg_ref<char> *ref,context *ctx)

{
  ulong uVar1;
  undefined4 uVar2;
  format_arg arg;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_28;
  undefined4 local_18;
  
  if (kind == index) {
    basic_format_args<fmt::v11::context>::get((format_arg *)&local_28.string,&ctx->args_,ref->index)
    ;
  }
  else {
    basic_format_args<fmt::v11::context>::get<char>
              ((format_arg *)&local_28.string,&ctx->args_,ref->name);
  }
  switch(local_18) {
  case 0:
    report_error("argument not found");
  case 1:
    uVar2 = 0xffffffff;
    if (-1 < local_28.int_value) {
      uVar2 = local_28.int_value;
    }
    uVar1 = (ulong)(int)uVar2;
    break;
  case 2:
    uVar1 = (ulong)local_28.uint_value;
    break;
  case 3:
    uVar1 = 0xffffffffffffffff;
    if (-1 < local_28._4_4_) {
      uVar1 = CONCAT44(local_28.long_long_value._4_4_,local_28.int_value);
    }
    break;
  case 5:
    uVar1 = 0xffffffffffffffff;
    if (local_28._8_8_ < 0) break;
  case 4:
  case 6:
    uVar1 = CONCAT44(local_28.long_long_value._4_4_,local_28.int_value);
    break;
  default:
    report_error("width/precision is not integer");
  }
  if (uVar1 >> 0x1f == 0) {
    return (int)uVar1;
  }
  report_error("width/precision is out of range");
}

Assistant:

FMT_CONSTEXPR int get_dynamic_spec(
    arg_id_kind kind, const arg_ref<typename Context::char_type>& ref,
    Context& ctx) {
  FMT_ASSERT(kind != arg_id_kind::none, "");
  auto arg =
      kind == arg_id_kind::index ? ctx.arg(ref.index) : ctx.arg(ref.name);
  if (!arg) report_error("argument not found");
  unsigned long long value = arg.visit(dynamic_spec_getter());
  if (value > to_unsigned(max_value<int>()))
    report_error("width/precision is out of range");
  return static_cast<int>(value);
}